

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLFormatter::writeCharRef(XMLFormatter *this,XMLSize_t toWrite)

{
  XMLSize_t XVar1;
  XMLCh tmpBuf [64];
  
  tmpBuf[0] = L'&';
  tmpBuf[1] = L'#';
  tmpBuf[2] = L'x';
  XMLString::sizeToText(toWrite,tmpBuf + 3,0x20,0x10,this->fMemoryManager);
  XVar1 = XMLString::stringLen(tmpBuf);
  tmpBuf[XVar1] = L';';
  tmpBuf[XVar1 + 1] = L'\0';
  formatBuf(this,tmpBuf,XVar1 + 1,NoEscapes,UnRep_Fail);
  return;
}

Assistant:

void XMLFormatter::writeCharRef(XMLSize_t toWrite)
{
    XMLCh tmpBuf[64];
    tmpBuf[0] = chAmpersand;
    tmpBuf[1] = chPound;
    tmpBuf[2] = chLatin_x;

    // Build a char ref for the current char
    XMLString::sizeToText(toWrite, &tmpBuf[3], 32, 16, fMemoryManager);
    const XMLSize_t bufLen = XMLString::stringLen(tmpBuf);
    tmpBuf[bufLen] = chSemiColon;
    tmpBuf[bufLen+1] = chNull;

    // write it out
    formatBuf(tmpBuf
            , bufLen + 1
            , XMLFormatter::NoEscapes
            , XMLFormatter::UnRep_Fail);

}